

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void getChessboardCorners
               (vector<cv::Mat,_std::allocator<cv::Mat>_> *images,
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *allFoundCorners,bool showResults)

{
  char cVar1;
  pointer pMVar2;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointBuf;
  _InputArray local_a0;
  long *local_88;
  pointer local_80;
  long alStack_78 [2];
  void *local_68;
  undefined8 uStack_60;
  long local_58;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  *local_48;
  Size local_40;
  Size local_38;
  
  pMVar2 = (images->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pMVar2 != (images->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    local_48 = allFoundCorners;
    do {
      local_68 = (void *)0x0;
      uStack_60 = 0;
      local_58 = 0;
      alStack_78[0] = 0;
      local_88 = (long *)CONCAT44(local_88._4_4_,0x1010000);
      local_38 = CHESSBOARD_DIMENSIONS;
      local_a0.sz.width = 0;
      local_a0.sz.height = 0;
      local_a0.flags = -0x7dfcfff3;
      local_a0.obj = (pointer)&local_68;
      local_80 = pMVar2;
      cVar1 = cv::findChessboardCorners((string *)&local_88,&local_38,&local_a0,3);
      if (cVar1 != '\0') {
        std::
        vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
        ::push_back(local_48,(value_type *)&local_68);
      }
      if (showResults) {
        alStack_78[0] = 0;
        local_88 = (long *)CONCAT44(local_88._4_4_,0x3010000);
        local_40 = CHESSBOARD_DIMENSIONS;
        local_a0.sz.width = 0;
        local_a0.sz.height = 0;
        local_a0.flags = -0x7efcfff3;
        local_a0.obj = (pointer)&local_68;
        local_80 = pMVar2;
        cv::drawChessboardCorners((string *)&local_88,&local_40,&local_a0,cVar1);
        local_88 = alStack_78;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"Searching for Corners...","");
        local_a0.sz.width = 0;
        local_a0.sz.height = 0;
        local_a0.flags = 0x1010000;
        local_a0.obj = pMVar2;
        cv::imshow((string *)&local_88,&local_a0);
        if (local_88 != alStack_78) {
          operator_delete(local_88,alStack_78[0] + 1);
        }
      }
      if (local_68 != (void *)0x0) {
        operator_delete(local_68,local_58 - (long)local_68);
      }
      pMVar2 = pMVar2 + 0x60;
    } while (pMVar2 != (images->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void getChessboardCorners(std::vector<cv::Mat> images, std::vector<std::vector<cv::Point2f>>& allFoundCorners, bool showResults = false)
{
    for (std::vector<cv::Mat>::iterator iter = images.begin(); iter != images.end(); iter++) {
        std::vector<cv::Point2f> pointBuf;
        bool found = findChessboardCorners(*iter, CHESSBOARD_DIMENSIONS, pointBuf, cv::CALIB_CB_ADAPTIVE_THRESH | cv::CALIB_CB_NORMALIZE_IMAGE);
        if (found) 
        {
            allFoundCorners.push_back(pointBuf);
        }
        if (showResults)
        {
            drawChessboardCorners(*iter, CHESSBOARD_DIMENSIONS, pointBuf, found);
            imshow("Searching for Corners...", *iter);
        }
    }
}